

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSMLoader.cpp
# Opt level: O1

void __thiscall
Assimp::CSMImporter::InternReadFile
          (CSMImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  undefined8 *puVar1;
  uint uVar2;
  bool bVar3;
  _Head_base<0UL,_aiAnimation_*,_false> _Var4;
  _Head_base<0UL,_aiAnimation_*,_false> _Var5;
  IOStream *pIVar6;
  pointer __src;
  Assimp AVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  aiAnimation *paVar11;
  aiNodeAnim *paVar12;
  aiNodeAnim **__dest;
  aiVectorKey *paVar13;
  aiVectorKey *__dest_00;
  ulong uVar14;
  Logger *this_00;
  aiNode *paVar15;
  aiNode **ppaVar16;
  aiNode *this_01;
  aiAnimation **ppaVar17;
  long *plVar18;
  runtime_error *prVar19;
  undefined1 uVar20;
  undefined1 check_comma;
  long lVar21;
  Assimp AVar22;
  aiNodeAnim *paVar23;
  ulong uVar24;
  ulong uVar25;
  _Alloc_hider _Var26;
  Assimp *pAVar27;
  ulong uVar28;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> anim;
  float d;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> anims_temp;
  vector<char,_std::allocator<char>_> mBuffer2;
  _Head_base<0UL,_aiAnimation_*,_false> local_120;
  ulong local_118;
  int local_10c;
  ulong local_108;
  undefined1 local_100 [24];
  pointer pFStack_e8;
  pointer local_d8;
  pointer local_d0;
  pointer local_c0;
  int local_ac;
  aiNodeAnim *local_a8;
  IOStream *local_a0;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  double local_58;
  aiNodeAnim *local_50;
  ulong local_48;
  aiNodeAnim *local_40;
  CSMImporter *local_38;
  
  paVar12 = (aiNodeAnim *)(local_100 + 0x10);
  local_100._0_8_ = paVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"rb","");
  iVar8 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_100._0_8_);
  local_a0 = (IOStream *)CONCAT44(extraout_var,iVar8);
  if ((aiNodeAnim *)local_100._0_8_ != paVar12) {
    operator_delete((void *)local_100._0_8_,(ulong)((long)(float *)local_100._16_8_ + 1));
  }
  if (local_a0 == (IOStream *)0x0) {
    prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_78,"Failed to open CSM file ",pFile);
    plVar18 = (long *)std::__cxx11::string::append((char *)&local_78);
    local_100._0_8_ = *plVar18;
    paVar23 = (aiNodeAnim *)(plVar18 + 2);
    if ((aiNodeAnim *)local_100._0_8_ == paVar23) {
      local_100._16_8_ = *(undefined8 *)&paVar23->mNodeName;
      pFStack_e8 = (pointer)plVar18[3];
      local_100._0_8_ = paVar12;
    }
    else {
      local_100._16_8_ = *(undefined8 *)&paVar23->mNodeName;
    }
    local_100._8_8_ = plVar18[1];
    *plVar18 = (long)paVar23;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::runtime_error::runtime_error(prVar19,(string *)local_100);
    *(undefined ***)prVar19 = &PTR__runtime_error_008e3168;
    __cxa_throw(prVar19,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  BaseImporter::TextFileToBuffer
            (local_a0,(vector<char,_std::allocator<char>_> *)&local_78,FORBID_EMPTY);
  _Var26._M_p = local_78._M_dataplus._M_p;
  local_38 = this;
  paVar11 = (aiAnimation *)operator_new(0x448);
  (paVar11->mName).length = 0;
  (paVar11->mName).data[0] = '\0';
  memset((paVar11->mName).data + 1,0x1b,0x3ff);
  paVar11->mDuration = -1.0;
  paVar11->mTicksPerSecond = 0.0;
  paVar11->mNumChannels = 0;
  paVar11->mChannels = (aiNodeAnim **)0x0;
  paVar11->mNumMeshChannels = 0;
  paVar11->mMeshChannels = (aiMeshAnim **)0x0;
  paVar11->mNumMorphMeshChannels = 0;
  paVar11->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  uVar24 = 0;
  local_120._M_head_impl = paVar11;
  iVar8 = 0xffffff;
LAB_00427a58:
  AVar7 = (Assimp)0x1;
  pAVar27 = (Assimp *)_Var26._M_p;
LAB_00427a60:
  AVar22 = *pAVar27;
  uVar10 = (uint)uVar24;
  _Var26._M_p = (pointer)pAVar27;
  if ((byte)AVar22 < 0x20) {
    if (AVar22 != (Assimp)0x9) goto LAB_00427a7a;
  }
  else if (AVar22 != (Assimp)0x20) {
    if (AVar22 != (Assimp)0x24) goto LAB_00427aac;
    _Var26._M_p = (pointer)(pAVar27 + 1);
    iVar9 = strncasecmp("firstframe",_Var26._M_p,10);
    if ((iVar9 == 0) && ((ulong)(byte)pAVar27[0xb] < 0x21)) {
      AVar22 = (Assimp)0x1;
      AVar7 = (Assimp)0x1;
      if ((0x100003601U >> ((ulong)(byte)pAVar27[0xb] & 0x3f) & 1) == 0) goto LAB_00427aa5;
      _Var26._M_p = (pointer)(pAVar27 + 0xc);
      bVar3 = true;
    }
    else {
LAB_00427aa5:
      AVar22 = AVar7;
      bVar3 = false;
    }
    if (bVar3) goto LAB_00427af9;
    iVar9 = strncasecmp("lastframe",_Var26._M_p,9);
    if (iVar9 == 0) {
      AVar22 = ((Assimp *)_Var26._M_p)[9];
      bVar3 = false;
      if (((ulong)(byte)AVar22 < 0x21) && ((0x100003601U >> ((ulong)(byte)AVar22 & 0x3f) & 1) != 0))
      {
        _Var26._M_p = _Var26._M_p + 10;
        bVar3 = true;
      }
    }
    else {
      bVar3 = false;
    }
    if (bVar3) goto LAB_00427b9b;
    iVar9 = strncasecmp("rate",_Var26._M_p,4);
    if (iVar9 == 0) {
      AVar22 = ((Assimp *)_Var26._M_p)[4];
      bVar3 = false;
      if (((ulong)(byte)AVar22 < 0x21) && ((0x100003601U >> ((ulong)(byte)AVar22 & 0x3f) & 1) != 0))
      {
        _Var26._M_p = _Var26._M_p + 5;
        bVar3 = true;
      }
    }
    else {
      bVar3 = false;
    }
    if (bVar3) goto LAB_00427c3a;
    iVar9 = strncasecmp("order",_Var26._M_p,5);
    if (iVar9 == 0) {
      bVar3 = false;
      if (((ulong)(byte)((Assimp *)_Var26._M_p)[5] < 0x21) &&
         ((0x100003601U >> ((ulong)(byte)((Assimp *)_Var26._M_p)[5] & 0x3f) & 1) != 0)) {
        _Var26._M_p = _Var26._M_p + 6;
        bVar3 = true;
      }
    }
    else {
      bVar3 = false;
    }
    if (bVar3) {
      local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_118 = uVar24;
      std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::reserve(&local_98,0x1e);
      goto LAB_00427cf5;
    }
    iVar9 = strncasecmp("points",_Var26._M_p,6);
    _Var4._M_head_impl = local_120._M_head_impl;
    if (iVar9 == 0) {
      bVar3 = false;
      if (((ulong)(byte)((Assimp *)_Var26._M_p)[6] < 0x21) &&
         ((0x100003601U >> ((ulong)(byte)((Assimp *)_Var26._M_p)[6] & 0x3f) & 1) != 0)) {
        _Var26._M_p = _Var26._M_p + 7;
        bVar3 = true;
      }
    }
    else {
      bVar3 = false;
    }
    if (!bVar3) goto LAB_00427a58;
    if ((local_120._M_head_impl)->mNumChannels == 0) {
      prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_100._0_8_ = local_100 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,
                 "CSM: \'$order\' section is required to appear prior to \'$points\'","");
      std::runtime_error::runtime_error(prVar19,(string *)local_100);
      *(undefined ***)prVar19 = &PTR__runtime_error_008e3168;
      __cxa_throw(prVar19,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_108 = 100;
    if ((iVar8 != 0xffffff) &&
       (local_108 = (ulong)((iVar8 - uVar10 >> 2) + (iVar8 - uVar10)),
       (local_120._M_head_impl)->mNumChannels != 0)) {
      uVar28 = local_108 * 0x18;
      uVar25 = 0;
      local_118 = uVar24;
      local_10c = iVar8;
      do {
        paVar13 = (aiVectorKey *)operator_new__(uVar28);
        if ((int)local_108 != 0) {
          uVar24 = 0;
          do {
            puVar1 = (undefined8 *)((long)&paVar13->mTime + uVar24);
            *puVar1 = 0;
            puVar1[1] = 0;
            *(undefined4 *)((long)&(paVar13->mValue).z + uVar24) = 0;
            uVar24 = uVar24 + 0x18;
          } while (uVar28 != uVar24);
        }
        (_Var4._M_head_impl)->mChannels[uVar25]->mPositionKeys = paVar13;
        uVar25 = uVar25 + 1;
        uVar24 = local_118;
        iVar8 = local_10c;
      } while (uVar25 < (_Var4._M_head_impl)->mNumChannels);
    }
    local_ac = 0;
    uVar28 = local_108;
    do {
      while (uVar25 = (ulong)(byte)*_Var26._M_p, 0x20 < uVar25) {
LAB_00427fd1:
        AVar7 = (Assimp)*_Var26._M_p;
        uVar24 = 0;
        if (0xf5 < (byte)((char)AVar7 - 0x3aU)) {
          uVar24 = 0;
          do {
            uVar24 = (ulong)((uint)(byte)((char)AVar7 - 0x30) + (int)uVar24 * 10);
            AVar7 = ((Assimp *)_Var26._M_p)[1];
            _Var26._M_p = _Var26._M_p + 1;
          } while (0xf5 < (byte)((char)AVar7 - 0x3aU));
        }
        iVar9 = (int)uVar24;
        local_10c = iVar8;
        if (iVar8 < iVar9) {
          local_10c = iVar9;
        }
        if ((local_120._M_head_impl)->mNumChannels != 0) {
          local_48 = (ulong)(uint)((int)uVar28 * 2);
          uVar25 = local_48 * 0x18;
          paVar12 = (aiNodeAnim *)((uVar28 & 0xffffffff) * 0x18);
          local_58 = (double)iVar9;
          paVar23 = (aiNodeAnim *)0x0;
          local_118 = uVar24;
          local_108 = uVar28;
          local_50 = paVar12;
          do {
            local_a8 = (local_120._M_head_impl)->mChannels[(long)paVar23];
            local_40 = paVar23;
            if (local_a8->mNumPositionKeys == (uint)uVar28) {
              paVar13 = local_a8->mPositionKeys;
              uVar10 = (uint)local_48;
              local_a8->mNumPositionKeys = uVar10;
              __dest_00 = (aiVectorKey *)operator_new__(uVar25);
              if (uVar10 != 0) {
                uVar24 = 0;
                do {
                  puVar1 = (undefined8 *)((long)&__dest_00->mTime + uVar24);
                  *puVar1 = 0;
                  puVar1[1] = 0;
                  *(undefined4 *)((long)&(__dest_00->mValue).z + uVar24) = 0;
                  uVar24 = uVar24 + 0x18;
                } while (uVar25 != uVar24);
              }
              local_a8->mPositionKeys = __dest_00;
              paVar12 = local_a8;
              memcpy(__dest_00,paVar13,(size_t)local_50);
              uVar28 = local_108;
              uVar24 = local_118;
              if (paVar13 != (aiVectorKey *)0x0) {
                operator_delete__(paVar13);
                uVar24 = local_118;
              }
            }
            while( true ) {
              uVar20 = SUB81(paVar12,0);
              uVar14 = (ulong)(byte)*_Var26._M_p;
              if (0x20 < uVar14) break;
              if ((0x100002600U >> (uVar14 & 0x3f) & 1) == 0) {
                if (uVar14 == 0) {
                  prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_100._0_8_ = local_100 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_100,
                             "CSM: Unexpected EOF occurred reading sample x coord","");
                  std::runtime_error::runtime_error(prVar19,(string *)local_100);
                  *(undefined ***)prVar19 = &PTR__runtime_error_008e3168;
                  __cxa_throw(prVar19,&DeadlyImportError::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                break;
              }
              _Var26._M_p = _Var26._M_p + 1;
            }
            iVar8 = strncasecmp("DROPOUT",_Var26._M_p,7);
            if ((iVar8 == 0) && ((ulong)(byte)((Assimp *)_Var26._M_p)[7] < 0x21)) {
              check_comma = true;
              uVar20 = 1;
              if ((0x100003601U >> ((ulong)(byte)((Assimp *)_Var26._M_p)[7] & 0x3f) & 1) == 0)
              goto LAB_00428137;
              _Var26._M_p = _Var26._M_p + 8;
              bVar3 = true;
            }
            else {
LAB_00428137:
              check_comma = uVar20;
              bVar3 = false;
            }
            if (bVar3) {
              this_00 = DefaultLogger::get();
              Logger::warn(this_00,"CSM: Encountered invalid marker data (DROPOUT)");
            }
            else {
              paVar13 = local_a8->mPositionKeys;
              uVar10 = local_a8->mNumPositionKeys;
              paVar13[uVar10].mTime = local_58;
              pAVar27 = (Assimp *)
                        fast_atoreal_move<float>
                                  ((Assimp *)_Var26._M_p,(char *)&paVar13[uVar10].mValue,
                                   (float *)0x1,(bool)check_comma);
              while( true ) {
                uVar24 = (ulong)(byte)*pAVar27;
                if (0x20 < uVar24) break;
                if ((0x100002600U >> (uVar24 & 0x3f) & 1) == 0) {
                  if (uVar24 == 0) {
                    prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_100._0_8_ = local_100 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_100,
                               "CSM: Unexpected EOF occurred reading sample y coord","");
                    std::runtime_error::runtime_error(prVar19,(string *)local_100);
                    *(undefined ***)prVar19 = &PTR__runtime_error_008e3168;
                    __cxa_throw(prVar19,&DeadlyImportError::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  break;
                }
                pAVar27 = pAVar27 + 1;
              }
              pAVar27 = (Assimp *)
                        fast_atoreal_move<float>
                                  (pAVar27,(char *)&paVar13[uVar10].mValue.y,(float *)0x1,
                                   (bool)*pAVar27);
              while( true ) {
                uVar24 = (ulong)(byte)*pAVar27;
                if (0x20 < uVar24) break;
                if ((0x100002600U >> (uVar24 & 0x3f) & 1) == 0) {
                  if (uVar24 == 0) {
                    prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
                    local_100._0_8_ = local_100 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_100,
                               "CSM: Unexpected EOF occurred reading sample z coord","");
                    std::runtime_error::runtime_error(prVar19,(string *)local_100);
                    *(undefined ***)prVar19 = &PTR__runtime_error_008e3168;
                    __cxa_throw(prVar19,&DeadlyImportError::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  break;
                }
                pAVar27 = pAVar27 + 1;
              }
              _Var26._M_p = fast_atoreal_move<float>
                                      (pAVar27,(char *)&paVar13[uVar10].mValue.z,(float *)0x1,
                                       (bool)*pAVar27);
              local_a8->mNumPositionKeys = local_a8->mNumPositionKeys + 1;
              uVar24 = local_118;
              uVar28 = local_108;
            }
            paVar23 = (aiNodeAnim *)((long)&(local_40->mNodeName).length + 1);
            paVar12 = (aiNodeAnim *)(ulong)(local_120._M_head_impl)->mNumChannels;
          } while (paVar23 < paVar12);
        }
        uVar28 = (ulong)(uint)((int)uVar28 << (local_ac == (int)uVar28));
        local_ac = local_ac + 1;
        iVar8 = local_10c;
      }
      if ((0x100000200U >> (uVar25 & 0x3f) & 1) == 0) {
        if ((0x3401UL >> (uVar25 & 0x3f) & 1) != 0) {
          for (; uVar25 = (ulong)(byte)*_Var26._M_p, uVar25 < 0x25; _Var26._M_p = _Var26._M_p + 1) {
            if ((0x100002600U >> (uVar25 & 0x3f) & 1) == 0) {
              if ((0x1000000001U >> (uVar25 & 0x3f) & 1) != 0) {
                if ((local_120._M_head_impl)->mNumChannels != 0) {
                  lVar21 = 0;
                  do {
                    if ((local_120._M_head_impl)->mChannels[lVar21]->mNumPositionKeys == 0) {
                      prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
                      local_100._0_8_ = local_100 + 0x10;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_100,"CSM: Invalid marker track","");
                      std::runtime_error::runtime_error(prVar19,(string *)local_100);
                      *(undefined ***)prVar19 = &PTR__runtime_error_008e3168;
                      __cxa_throw(prVar19,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    lVar21 = lVar21 + 1;
                  } while ((local_120._M_head_impl)->mNumChannels != (uint)lVar21);
                }
                goto LAB_00427a58;
              }
              break;
            }
          }
        }
        goto LAB_00427fd1;
      }
      _Var26._M_p = _Var26._M_p + 1;
    } while( true );
  }
  pAVar27 = pAVar27 + 1;
  goto LAB_00427a60;
LAB_00427af9:
  for (; (AVar7 = (Assimp)*_Var26._M_p, AVar7 == (Assimp)0x20 || (AVar7 == (Assimp)0x9));
      _Var26._M_p = _Var26._M_p + 1) {
  }
  _Var26._M_p = _Var26._M_p + (((char)AVar7 - 0x2bU & 0xfd) == 0);
  AVar22 = (Assimp)*_Var26._M_p;
  uVar10 = 0;
  if (0xf5 < (byte)((char)AVar22 - 0x3aU)) {
    uVar10 = 0;
    do {
      uVar10 = (uint)(byte)((char)AVar22 - 0x30) + uVar10 * 10;
      AVar22 = ((Assimp *)_Var26._M_p)[1];
      _Var26._M_p = _Var26._M_p + 1;
    } while (0xf5 < (byte)((char)AVar22 - 0x3aU));
  }
  uVar2 = -uVar10;
  if (AVar7 != (Assimp)0x2d) {
    uVar2 = uVar10;
  }
  uVar24 = (ulong)uVar2;
  goto LAB_00427a58;
LAB_00427b9b:
  for (; (AVar7 = (Assimp)*_Var26._M_p, AVar7 == (Assimp)0x20 || (AVar7 == (Assimp)0x9));
      _Var26._M_p = _Var26._M_p + 1) {
  }
  _Var26._M_p = _Var26._M_p + (((char)AVar7 - 0x2bU & 0xfd) == 0);
  AVar22 = (Assimp)*_Var26._M_p;
  iVar9 = 0;
  if (0xf5 < (byte)((char)AVar22 - 0x3aU)) {
    iVar9 = 0;
    do {
      iVar9 = (uint)(byte)((char)AVar22 - 0x30) + iVar9 * 10;
      AVar22 = ((Assimp *)_Var26._M_p)[1];
      _Var26._M_p = _Var26._M_p + 1;
    } while (0xf5 < (byte)((char)AVar22 - 0x3aU));
  }
  iVar8 = -iVar9;
  if (AVar7 != (Assimp)0x2d) {
    iVar8 = iVar9;
  }
  goto LAB_00427a58;
LAB_00427c3a:
  for (; ((Assimp)*_Var26._M_p == (Assimp)0x20 || ((Assimp)*_Var26._M_p == (Assimp)0x9));
      _Var26._M_p = _Var26._M_p + 1) {
  }
  _Var26._M_p = fast_atoreal_move<float>(_Var26._M_p,local_100,(float *)0x1,(bool)AVar22);
  (local_120._M_head_impl)->mTicksPerSecond = (double)(float)local_100._0_4_;
  goto LAB_00427a58;
LAB_00427cf5:
  __src = local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
          super__Vector_impl_data._M_start;
  _Var4._M_head_impl = local_120._M_head_impl;
  uVar24 = (ulong)(byte)*_Var26._M_p;
  if (uVar24 < 0x21) {
    if ((0x3401UL >> (uVar24 & 0x3f) & 1) == 0) {
      if ((0x100000200U >> (uVar24 & 0x3f) & 1) != 0) {
        _Var26._M_p = _Var26._M_p + 1;
        goto LAB_00427cf5;
      }
    }
    else {
      for (; uVar24 = (ulong)(byte)*_Var26._M_p, uVar24 < 0x25; _Var26._M_p = _Var26._M_p + 1) {
        if ((0x100002600U >> (uVar24 & 0x3f) & 1) == 0) {
          if (uVar24 == 0x24) {
            uVar10 = (uint)((ulong)((long)local_98.
                                          super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_98.
                                         super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3);
            (local_120._M_head_impl)->mNumChannels = uVar10;
            if (uVar10 == 0) {
              prVar19 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_100._0_8_ = local_100 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_100,"CSM: Empty $order section","");
              std::runtime_error::runtime_error(prVar19,(string *)local_100);
              *(undefined ***)prVar19 = &PTR__runtime_error_008e3168;
              __cxa_throw(prVar19,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            __dest = (aiNodeAnim **)
                     operator_new__((long)local_98.
                                          super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_98.
                                          super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start & 0x7fffffff8);
            (_Var4._M_head_impl)->mChannels = __dest;
            memcpy(__dest,__src,(ulong)(_Var4._M_head_impl)->mNumChannels << 3);
            uVar24 = local_118;
            if (__src != (pointer)0x0) {
              operator_delete(__src,(long)local_98.
                                          super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)__src);
              uVar24 = local_118;
            }
            goto LAB_00427a58;
          }
          break;
        }
      }
    }
  }
  paVar12 = (aiNodeAnim *)operator_new(0x438);
  (paVar12->mNodeName).length = 0;
  (paVar12->mNodeName).data[0] = '\0';
  memset((paVar12->mNodeName).data + 1,0x1b,0x3ff);
  paVar12->mRotationKeys = (aiQuatKey *)0x0;
  paVar12->mNumScalingKeys = 0;
  *(undefined8 *)&paVar12->mNumPositionKeys = 0;
  *(undefined8 *)((long)&paVar12->mPositionKeys + 4) = 0;
  paVar12->mScalingKeys = (aiVectorKey *)0x0;
  paVar12->mPreState = aiAnimBehaviour_DEFAULT;
  paVar12->mPostState = aiAnimBehaviour_DEFAULT;
  local_100._0_8_ = paVar12;
  std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::emplace_back<aiNodeAnim*>
            ((vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *)&local_98,(aiNodeAnim **)local_100);
  paVar12 = local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
            super__Vector_impl_data._M_finish[-1];
  lVar21 = 0;
  while( true ) {
    AVar7 = ((Assimp *)_Var26._M_p)[lVar21];
    if (((ulong)(byte)AVar7 < 0x21) && ((0x100003601U >> ((ulong)(byte)AVar7 & 0x3f) & 1) != 0))
    break;
    *(Assimp *)((paVar12->mNodeName).data + lVar21) = AVar7;
    lVar21 = lVar21 + 1;
  }
  (paVar12->mNodeName).data[lVar21] = '\0';
  (paVar12->mNodeName).length = (ai_uint32)lVar21;
  _Var26._M_p = _Var26._M_p + lVar21;
  goto LAB_00427cf5;
LAB_00427a7a:
  if (AVar22 == (Assimp)0x0) {
    (local_120._M_head_impl)->mDuration = (double)(int)(iVar8 - ((int)uVar10 >> 0x1f & uVar10));
    paVar15 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(paVar15);
    pScene->mRootNode = paVar15;
    (paVar15->mName).length = 0xe;
    builtin_strncpy((paVar15->mName).data,"$CSM_DummyRoot",0xf);
    paVar15->mNumChildren = (local_120._M_head_impl)->mNumChannels;
    ppaVar16 = (aiNode **)operator_new__((ulong)(local_120._M_head_impl)->mNumChannels << 3);
    paVar15->mChildren = ppaVar16;
    if ((local_120._M_head_impl)->mNumChannels != 0) {
      uVar24 = 0;
      do {
        paVar12 = (local_120._M_head_impl)->mChannels[uVar24];
        this_01 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(this_01);
        pScene->mRootNode->mChildren[uVar24] = this_01;
        paVar15 = (aiNode *)(local_120._M_head_impl)->mChannels[uVar24];
        if (this_01 != paVar15) {
          uVar10 = (paVar15->mName).length;
          (this_01->mName).length = uVar10;
          memcpy((this_01->mName).data,(paVar15->mName).data,(ulong)uVar10);
          (this_01->mName).data[uVar10] = '\0';
        }
        this_01->mParent = pScene->mRootNode;
        paVar13 = paVar12->mPositionKeys;
        (this_01->mTransformation).a1 = 1.0;
        (this_01->mTransformation).a2 = 0.0;
        (this_01->mTransformation).a3 = 0.0;
        (this_01->mTransformation).a4 = 0.0;
        (this_01->mTransformation).b1 = 0.0;
        (this_01->mTransformation).b2 = 1.0;
        (this_01->mTransformation).b3 = 0.0;
        (this_01->mTransformation).b4 = 0.0;
        (this_01->mTransformation).c1 = 0.0;
        (this_01->mTransformation).c2 = 0.0;
        (this_01->mTransformation).c3 = 1.0;
        (this_01->mTransformation).c4 = 0.0;
        (this_01->mTransformation).d1 = 0.0;
        (this_01->mTransformation).d2 = 0.0;
        (this_01->mTransformation).d3 = 0.0;
        (this_01->mTransformation).d4 = 1.0;
        (this_01->mTransformation).a4 = (paVar13->mValue).x;
        (this_01->mTransformation).b4 = (paVar13->mValue).y;
        (this_01->mTransformation).c4 = (paVar13->mValue).z;
        uVar24 = uVar24 + 1;
      } while (uVar24 < (local_120._M_head_impl)->mNumChannels);
    }
    _Var4._M_head_impl = local_120._M_head_impl;
    pScene->mNumAnimations = 1;
    ppaVar17 = (aiAnimation **)operator_new__(8);
    pIVar6 = local_a0;
    _Var5._M_head_impl = local_120._M_head_impl;
    pScene->mAnimations = ppaVar17;
    ((_Var4._M_head_impl)->mName).length = 0xf;
    builtin_strncpy(((_Var4._M_head_impl)->mName).data,"$CSM_Mas",8);
    builtin_strncpy(((_Var4._M_head_impl)->mName).data + 7,"sterAnim",8);
    ((_Var4._M_head_impl)->mName).data[0xf] = '\0';
    local_120._M_head_impl = (aiAnimation *)0x0;
    *pScene->mAnimations = _Var5._M_head_impl;
    *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 1;
    if (local_38->noSkeletonMesh == false) {
      SkeletonMeshBuilder::SkeletonMeshBuilder
                ((SkeletonMeshBuilder *)local_100,pScene,pScene->mRootNode,true);
      if (local_d0 != (pointer)0x0) {
        operator_delete(local_d0,(long)local_c0 - (long)local_d0);
      }
      if (pFStack_e8 != (pointer)0x0) {
        operator_delete(pFStack_e8,(long)local_d8 - (long)pFStack_e8);
      }
      if ((aiNodeAnim *)local_100._0_8_ != (aiNodeAnim *)0x0) {
        operator_delete((void *)local_100._0_8_,local_100._16_8_ - local_100._0_8_);
      }
    }
    std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::~unique_ptr
              ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&local_120);
    if ((Assimp *)local_78._M_dataplus._M_p != (Assimp *)0x0) {
      operator_delete(local_78._M_dataplus._M_p,
                      local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p);
    }
    (*pIVar6->_vptr_IOStream[1])(pIVar6);
    return;
  }
LAB_00427aac:
  while ((0xd < (byte)*_Var26._M_p || ((0x2401U >> ((byte)*_Var26._M_p & 0x1f) & 1) == 0))) {
    _Var26._M_p = (pointer)((Assimp *)_Var26._M_p + 1);
  }
  for (; ((Assimp)*_Var26._M_p == (Assimp)0xd || ((Assimp)*_Var26._M_p == (Assimp)0xa));
      _Var26._M_p = _Var26._M_p + 1) {
  }
  goto LAB_00427a58;
}

Assistant:

void CSMImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL) {
        throw DeadlyImportError( "Failed to open CSM file " + pFile + ".");
    }

    // allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    std::unique_ptr<aiAnimation> anim(new aiAnimation());
    int first = 0, last = 0x00ffffff;

    // now process the file and look out for '$' sections
    while (1)   {
        SkipSpaces(&buffer);
        if ('\0' == *buffer)
            break;

        if ('$'  == *buffer)    {
            ++buffer;
            if (TokenMatchI(buffer,"firstframe",10))    {
                SkipSpaces(&buffer);
                first = strtol10(buffer,&buffer);
            }
            else if (TokenMatchI(buffer,"lastframe",9))     {
                SkipSpaces(&buffer);
                last = strtol10(buffer,&buffer);
            }
            else if (TokenMatchI(buffer,"rate",4))  {
                SkipSpaces(&buffer);
                float d;
                buffer = fast_atoreal_move<float>(buffer,d);
                anim->mTicksPerSecond = d;
            }
            else if (TokenMatchI(buffer,"order",5)) {
                std::vector< aiNodeAnim* > anims_temp;
                anims_temp.reserve(30);
                while (1)   {
                    SkipSpaces(&buffer);
                    if (IsLineEnd(*buffer) && SkipSpacesAndLineEnd(&buffer) && *buffer == '$')
                        break; // next section

                    // Construct a new node animation channel and setup its name
                    anims_temp.push_back(new aiNodeAnim());
                    aiNodeAnim* nda = anims_temp.back();

                    char* ot = nda->mNodeName.data;
                    while (!IsSpaceOrNewLine(*buffer))
                        *ot++ = *buffer++;

                    *ot = '\0';
                    nda->mNodeName.length = (size_t)(ot-nda->mNodeName.data);
                }

                anim->mNumChannels = static_cast<unsigned int>(anims_temp.size());
                if (!anim->mNumChannels)
                    throw DeadlyImportError("CSM: Empty $order section");

                // copy over to the output animation
                anim->mChannels = new aiNodeAnim*[anim->mNumChannels];
                ::memcpy(anim->mChannels,&anims_temp[0],sizeof(aiNodeAnim*)*anim->mNumChannels);
            }
            else if (TokenMatchI(buffer,"points",6))    {
                if (!anim->mNumChannels)
                    throw DeadlyImportError("CSM: \'$order\' section is required to appear prior to \'$points\'");

                // If we know how many frames we'll read, we can preallocate some storage
                unsigned int alloc = 100;
                if (last != 0x00ffffff)
                {
                    alloc = last-first;
                    alloc += alloc>>2u; // + 25%
                    for (unsigned int i = 0; i < anim->mNumChannels;++i)
                        anim->mChannels[i]->mPositionKeys = new aiVectorKey[alloc];
                }

                unsigned int filled = 0;

                // Now read all point data.
                while (1)   {
                    SkipSpaces(&buffer);
                    if (IsLineEnd(*buffer) && (!SkipSpacesAndLineEnd(&buffer) || *buffer == '$'))   {
                        break; // next section
                    }

                    // read frame
                    const int frame = ::strtoul10(buffer,&buffer);
                    last  = std::max(frame,last);
                    first = std::min(frame,last);
                    for (unsigned int i = 0; i < anim->mNumChannels;++i)    {

                        aiNodeAnim* s = anim->mChannels[i];
                        if (s->mNumPositionKeys == alloc)   { /* need to reallocate? */

                            aiVectorKey* old = s->mPositionKeys;
                            s->mPositionKeys = new aiVectorKey[s->mNumPositionKeys = alloc*2];
                            ::memcpy(s->mPositionKeys,old,sizeof(aiVectorKey)*alloc);
                            delete[] old;
                        }

                        // read x,y,z
                        if(!SkipSpacesAndLineEnd(&buffer))
                            throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample x coord");

                        if (TokenMatchI(buffer, "DROPOUT", 7))  {
                            // seems this is invalid marker data; at least the doc says it's possible
                            ASSIMP_LOG_WARN("CSM: Encountered invalid marker data (DROPOUT)");
                        }
                        else    {
                            aiVectorKey* sub = s->mPositionKeys + s->mNumPositionKeys;
                            sub->mTime = (double)frame;
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.x);

                            if(!SkipSpacesAndLineEnd(&buffer))
                                throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample y coord");
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.y);

                            if(!SkipSpacesAndLineEnd(&buffer))
                                throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample z coord");
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.z);

                            ++s->mNumPositionKeys;
                        }
                    }

                    // update allocation granularity
                    if (filled == alloc)
                        alloc *= 2;

                    ++filled;
                }
                // all channels must be complete in order to continue safely.
                for (unsigned int i = 0; i < anim->mNumChannels;++i)    {

                    if (!anim->mChannels[i]->mNumPositionKeys)
                        throw DeadlyImportError("CSM: Invalid marker track");
                }
            }
        }
        else    {
            // advance to the next line
            SkipLine(&buffer);
        }
    }

    // Setup a proper animation duration
    anim->mDuration = last - std::min( first, 0 );

    // build a dummy root node with the tiny markers as children
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("$CSM_DummyRoot");

    pScene->mRootNode->mNumChildren = anim->mNumChannels;
    pScene->mRootNode->mChildren = new aiNode* [anim->mNumChannels];

    for (unsigned int i = 0; i < anim->mNumChannels;++i)    {
        aiNodeAnim* na = anim->mChannels[i];

        aiNode* nd  = pScene->mRootNode->mChildren[i] = new aiNode();
        nd->mName   = anim->mChannels[i]->mNodeName;
        nd->mParent = pScene->mRootNode;

        aiMatrix4x4::Translation(na->mPositionKeys[0].mValue, nd->mTransformation);
    }

    // Store the one and only animation in the scene
    pScene->mAnimations    = new aiAnimation*[pScene->mNumAnimations=1];
    anim->mName.Set("$CSM_MasterAnim");
    pScene->mAnimations[0] = anim.release();

    // mark the scene as incomplete and run SkeletonMeshBuilder on it
    pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;

    if (!noSkeletonMesh) {
        SkeletonMeshBuilder maker(pScene,pScene->mRootNode,true);
    }
}